

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiTextEditState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *__src;
  unsigned_short *puVar1;
  int iVar2;
  value_type_conflict1 *pvVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = obj->CurLenW;
  if (iVar4 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x1d0b,
                  "bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS(ImGuiTextEditState *, int, const ImWchar *, int)"
                 );
  }
  if (iVar4 + new_text_len < (obj->Text).Size) {
    lVar5 = (long)new_text_len;
    iVar2 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar5);
    if (obj->CurLenA + iVar2 < obj->BufSizeA) {
      puVar1 = (obj->Text).Data;
      if (iVar4 - pos != 0) {
        __src = puVar1 + pos;
        memmove(__src + lVar5,__src,(long)(iVar4 - pos) * 2);
      }
      memcpy(puVar1 + pos,new_text,lVar5 * 2);
      iVar4 = new_text_len + obj->CurLenW;
      obj->CurLenW = iVar4;
      obj->CurLenA = obj->CurLenA + iVar2;
      pvVar3 = ImVector<unsigned_short>::operator[](&obj->Text,iVar4);
      *pvVar3 = 0;
      return true;
    }
  }
  return false;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);
    if (new_text_len + text_len + 1 > obj->Text.Size)
        return false;

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufSizeA)
        return false;

    ImWchar* text = obj->Text.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->Text[obj->CurLenW] = '\0';

    return true;
}